

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::genOccluderGeometry
          (ObjectData *__return_storage_ptr__,OccludingGeometryComplexityCostCase *this)

{
  uint uVar1;
  undefined8 uVar2;
  deUint32 dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int x;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  float fVar16;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar17;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> vertices;
  Random rng;
  vector<float,_std::allocator<float>_> local_228;
  ulong local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_1f0;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  undefined4 local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  undefined4 local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  undefined4 local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  undefined4 local_19c;
  float local_198;
  float local_194;
  float local_190;
  undefined4 local_18c;
  float local_188;
  float local_184;
  float local_180;
  undefined4 local_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  undefined1 local_128 [16];
  deRandom local_110;
  ProgramSources local_100;
  
  local_158._8_8_ = local_158._0_8_;
  Utils::getBaseShader();
  uVar1 = this->m_resolution;
  uVar7 = (ulong)uVar1;
  dVar3 = deStringHash((this->super_RenderCountCase).super_BaseCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  uVar4 = tcu::CommandLine::getBaseSeed
                    (((this->super_RenderCountCase).super_BaseCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_cmdLine);
  _local_178 = ZEXT416((uint)this->m_xyNoise);
  local_168 = ZEXT416((uint)this->m_zNoise);
  uVar10 = uVar1 + 1;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&local_1f0,(long)(int)(uVar10 * uVar10),(allocator_type *)&local_1d8);
  uVar12 = (dVar3 >> 0x10 ^ dVar3 ^ 0x3d) * 9;
  uVar12 = (uVar12 >> 4 ^ uVar12) * 0x27d4eb2d;
  local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  deRandom_init(&local_110,uVar12 >> 0xf ^ uVar4 ^ uVar12);
  local_210 = (ulong)uVar10;
  if (uVar1 < 0x7fffffff) {
    local_148 = (float)local_178._0_4_ + (float)local_178._0_4_;
    local_138 = -(float)local_168._0_4_;
    uStack_134 = local_168._4_4_ ^ 0x80000000;
    uStack_130 = local_168._8_4_ ^ 0x80000000;
    uStack_12c = local_168._12_4_ ^ 0x80000000;
    local_168._0_4_ = (float)local_168._0_4_ + (float)local_168._0_4_;
    fStack_170 = -(float)local_178._0_4_;
    fStack_16c = -(float)local_178._0_4_;
    local_178 = (undefined1  [8])(CONCAT44(local_178._0_4_,local_178._0_4_) ^ 0x8000000080000000);
    lVar14 = 0;
    uVar12 = 0;
    fStack_144 = local_148;
    fStack_140 = local_148;
    fStack_13c = local_148;
    do {
      fVar16 = (float)(int)uVar12 / (float)(int)uVar1;
      local_128 = ZEXT416((uint)(fVar16 + fVar16 + -1.0));
      uVar11 = 0;
      do {
        fVar16 = (float)(int)uVar11 / (float)(int)uVar1;
        local_158 = ZEXT416((uint)(fVar16 + fVar16 + -1.0));
        local_208 = 0;
        uStack_200 = 0;
        if ((((uVar12 != uVar1) && (uVar7 != uVar11)) && (uVar12 != 0)) && (uVar11 != 0)) {
          local_208._0_4_ = deRandom_getFloat(&local_110);
          local_208._4_4_ = extraout_XMM0_Db;
          fVar16 = deRandom_getFloat(&local_110);
          fVar17 = local_208._4_4_ * fStack_140;
          local_208 = CONCAT44(fVar16 * fStack_144 + (float)local_178._4_4_,
                               (float)local_208 * local_148 + (float)local_178._0_4_);
          uStack_200 = CONCAT44(extraout_XMM0_Db_00 * fStack_13c + fStack_16c,fVar17 + fStack_170);
        }
        fVar16 = deRandom_getFloat(&local_110);
        iVar5 = (int)lVar14 + (int)uVar11;
        *(ulong *)local_1f0.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data =
             CONCAT44((float)local_128._0_4_ + local_208._4_4_,
                      (float)local_158._0_4_ + (float)local_208);
        local_1f0.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data[2] =
             fVar16 * (float)local_168._0_4_ + local_138 + 0.2;
        uVar11 = uVar11 + 1;
      } while (local_210 != uVar11);
      lVar14 = lVar14 + local_210;
      bVar15 = uVar12 != uVar1;
      uVar12 = uVar12 + 1;
    } while (bVar15);
  }
  local_158._0_8_ = __return_storage_ptr__;
  std::vector<float,_std::allocator<float>_>::reserve(&local_228,(long)(int)(uVar1 * uVar1 * 6));
  if (0 < (int)uVar1) {
    lVar14 = 0;
    uVar11 = uVar7;
    uVar12 = 0;
    do {
      local_208 = CONCAT44(local_208._4_4_,uVar12 + 1);
      uVar13 = 0;
      do {
        iVar5 = (int)uVar13;
        iVar6 = (int)lVar14 + iVar5;
        iVar8 = (int)lVar14 + iVar5 + 1;
        iVar9 = (int)uVar11 + 1 + iVar5;
        iVar5 = (int)uVar11 + 2 + iVar5;
        local_1d8 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data[0];
        local_1d4 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data[1];
        local_1d0 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data[2];
        local_1cc = 0;
        local_1c8 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[0];
        local_1c4 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[1];
        local_1c0 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[2];
        local_1bc = 0x3f800000;
        local_1b8 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[0];
        local_1b4 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[1];
        local_1b0 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[2];
        local_1ac = 0x40000000;
        local_1a8 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data[0];
        local_1a4 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data[1];
        local_1a0 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data[2];
        local_19c = 0;
        local_198 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[0];
        local_194 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[1];
        local_190 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[2];
        local_18c = 0x3f800000;
        local_188 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[0];
        local_184 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[1];
        local_180 = local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[2];
        local_17c = 0x40000000;
        std::vector<float,std::allocator<float>>::_M_range_insert<float_const*>
                  ((vector<float,std::allocator<float>> *)&local_228,
                   local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_1d8,local_178);
        uVar13 = uVar13 + 1;
      } while (uVar7 != uVar13);
      uVar11 = uVar11 + local_210;
      lVar14 = lVar14 + local_210;
      uVar12 = (uint)(float)local_208;
    } while ((float)local_208 != (float)uVar1);
  }
  if (local_1f0.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar2 = local_158._0_8_;
  ObjectData::ObjectData((ObjectData *)local_158._0_8_,&local_100,&local_228);
  if (local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  return (ObjectData *)uVar2;
}

Assistant:

virtual ObjectData	genOccluderGeometry						(void) const
	{
		return ObjectData(Utils::getBaseShader(),
						  Utils::getFullScreenGrid(m_resolution,
						  deInt32Hash(deStringHash(getName())) ^ m_testCtx.getCommandLine().getBaseSeed(),
						  0.2f,
						  m_zNoise,
						  m_xyNoise));
	}